

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printing.cpp
# Opt level: O3

void __thiscall PrintingTest_Print_Test::TestBody(PrintingTest_Print_Test *this)

{
  char *pcVar1;
  Function *pFVar2;
  Name NVar3;
  Name NVar4;
  undefined1 local_5c8 [8];
  Module wasm;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [7];
  ios_base local_158 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  internal local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  AssertHelper local_20;
  
  ::wasm::Module::Module((Module *)local_5c8);
  wasm.tagsMap._M_h._M_single_bucket = (__node_base_ptr)local_1c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&wasm.tagsMap._M_h._M_single_bucket,
             "\n    (module\n      (func $a (result i32)\n        (i32.const 10)\n      )\n      (func $b\n        (drop\n          (i32.const 20)\n        )\n      )\n    )\n  "
             ,"");
  PrintTest::parseWast
            (&this->super_PrintingTest,(Module *)local_5c8,
             (string *)&wasm.tagsMap._M_h._M_single_bucket);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wasm.tagsMap._M_h._M_single_bucket != local_1c8) {
    operator_delete(wasm.tagsMap._M_h._M_single_bucket,local_1c8[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&wasm.tagsMap._M_h._M_single_bucket);
  pcVar1 = (char *)::wasm::IString::interned(1,"a",0);
  NVar3.super_IString.str._M_str = pcVar1;
  NVar3.super_IString.str._M_len = (size_t)local_5c8;
  pFVar2 = (Function *)::wasm::Module::getFunction(NVar3);
  std::operator<<((ostream *)local_1c8[0]._M_local_buf,pFVar2);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[41]>
            (local_30,"ss.str()","R\"print((func $a (result i32)\n (i32.const 10)\n)\n)print\"",
             &local_50,(char (*) [41])"(func $a (result i32)\n (i32.const 10)\n)\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/printing.cpp"
               ,0x20,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&wasm.tagsMap._M_h._M_single_bucket);
  std::ios_base::~ios_base(local_158);
  std::__cxx11::stringstream::stringstream((stringstream *)&wasm.tagsMap._M_h._M_single_bucket);
  pcVar1 = (char *)::wasm::IString::interned(1,"b",0);
  NVar4.super_IString.str._M_str = pcVar1;
  NVar4.super_IString.str._M_len = (size_t)local_5c8;
  pFVar2 = (Function *)::wasm::Module::getFunction(NVar4);
  std::operator<<((ostream *)local_1c8[0]._M_local_buf,pFVar2);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[39]>
            (local_30,"ss.str()","R\"print((func $b\n (drop\n  (i32.const 20)\n )\n)\n)print\"",
             &local_50,(char (*) [39])"(func $b\n (drop\n  (i32.const 20)\n )\n)\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/printing.cpp"
               ,0x2a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&wasm.tagsMap._M_h._M_single_bucket);
  std::ios_base::~ios_base(local_158);
  ::wasm::Module::~Module((Module *)local_5c8);
  return;
}

Assistant:

TEST_F(PrintingTest, Print) {
  auto moduleText = R"wasm(
    (module
      (func $a (result i32)
        (i32.const 10)
      )
      (func $b
        (drop
          (i32.const 20)
        )
      )
    )
  )wasm";

  Module wasm;
  parseWast(wasm, moduleText);

  {
    std::stringstream ss;
    ss << *wasm.getFunction("a");
    EXPECT_EQ(ss.str(), R"print((func $a (result i32)
 (i32.const 10)
)
)print");
  }
  {
    std::stringstream ss;
    ss << *wasm.getFunction("b");
    EXPECT_EQ(ss.str(), R"print((func $b
 (drop
  (i32.const 20)
 )
)
)print");
  }
}